

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::FileDescriptorTables::AddEnumValueByNumber
          (FileDescriptorTables *this,EnumValueDescriptor *value)

{
  bool bVar1;
  int local_34;
  EnumDescriptor *local_30;
  undefined1 local_28 [8];
  EnumIntPair key;
  EnumValueDescriptor *value_local;
  FileDescriptorTables *this_local;
  
  key._8_8_ = value;
  local_30 = EnumValueDescriptor::type(value);
  local_34 = EnumValueDescriptor::number((EnumValueDescriptor *)key._8_8_);
  std::pair<const_google::protobuf::EnumDescriptor_*,_int>::
  pair<const_google::protobuf::EnumDescriptor_*,_int,_true>
            ((pair<const_google::protobuf::EnumDescriptor_*,_int> *)local_28,&local_30,&local_34);
  bVar1 = InsertIfNotPresent<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>>,std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*>
                    (&this->enum_values_by_number_,
                     (pair<const_google::protobuf::EnumDescriptor_*,_int> *)local_28,
                     (EnumValueDescriptor **)&key.second);
  return bVar1;
}

Assistant:

bool FileDescriptorTables::AddEnumValueByNumber(
    const EnumValueDescriptor* value) {
  EnumIntPair key(value->type(), value->number());
  return InsertIfNotPresent(&enum_values_by_number_, key, value);
}